

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_index.c
# Opt level: O1

int vmcache_index_remove(VMEMcache *cache,cache_entry *entry)

{
  os_rwlock_t *rwlock;
  critnib *c;
  int iVar1;
  uint64_t uVar2;
  void *pvVar3;
  long lVar4;
  int *piVar5;
  index *piVar6;
  
  piVar6 = cache->index;
  if (piVar6->sharding != 0) {
    uVar2 = hash((entry->key).ksize,(char *)(entry + 1));
    piVar6 = (index *)(piVar6->bucket + (uVar2 & 0xff));
  }
  c = piVar6->bucket[0];
  rwlock = &c->lock;
  iVar1 = os_rwlock_wrlock(rwlock);
  if (iVar1 == 0) {
    pvVar3 = critnib_remove(c,entry);
    if (pvVar3 == (void *)0x0) {
      iVar1 = os_rwlock_unlock(rwlock);
      if (iVar1 == 0) {
        out_err("/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/src/vmemcache_index.c"
                ,200,"vmcache_index_remove",
                "vmcache_index_remove: cannot find an element with the given key in the index");
        piVar5 = __errno_location();
        *piVar5 = 0x16;
        return -1;
      }
    }
    else {
      c->leaf_count = c->leaf_count - 1;
      c->evict_count = c->evict_count + 1;
      lVar4 = malloc_usable_size(entry);
      c->DRAM_usage = c->DRAM_usage - lVar4;
      vmemcache_entry_release(cache,entry);
      iVar1 = os_rwlock_unlock(rwlock);
      if (iVar1 == 0) {
        return 0;
      }
    }
    piVar5 = __errno_location();
    *piVar5 = iVar1;
    abort();
  }
  piVar5 = __errno_location();
  *piVar5 = iVar1;
  abort();
}

Assistant:

int
vmcache_index_remove(VMEMcache *cache, struct cache_entry *entry)
{
	struct critnib *c = shard(cache->index, entry->key.ksize,
		entry->key.key);

	util_rwlock_wrlock(&c->lock);

	struct cache_entry *v = critnib_remove(c, entry);
	if (v == NULL) {
		util_rwlock_unlock(&c->lock);
		ERR(
			"vmcache_index_remove: cannot find an element with the given key in the index");
		errno = EINVAL;
		return -1;
	}

#ifdef STATS_ENABLED
	c->leaf_count--;
	c->evict_count++;
	c->DRAM_usage -= malloc_usable_size(entry);
#endif

	vmemcache_entry_release(cache, entry);

	util_rwlock_unlock(&c->lock);

	return 0;
}